

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condvar.c
# Opt level: O2

int nn_condvar_wait(nn_condvar_t *cond,nn_mutex_t *lock,int timeout)

{
  FILE *__stream;
  uint errnum;
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  timeval local_48;
  timespec ts;
  
  if (timeout < 0) {
    pthread_cond_wait((pthread_cond_t *)cond,(pthread_mutex_t *)lock);
    iVar2 = 0;
  }
  else {
    errnum = gettimeofday(&local_48,(__timezone_ptr_t)0x0);
    if (errnum != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar4 = nn_err_strerror(errnum);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)errnum,
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/utils/condvar.c"
              ,0x74);
      fflush(_stderr);
      nn_err_abort();
    }
    lVar3 = (ulong)(((uint)timeout % 1000) * 1000) + local_48.tv_usec;
    ts.tv_sec = lVar3 / 1000000 + (ulong)(uint)timeout / 1000 + local_48.tv_sec;
    ts.tv_nsec = (lVar3 % 1000000) * 1000;
    iVar1 = pthread_cond_timedwait((pthread_cond_t *)cond,(pthread_mutex_t *)lock,(timespec *)&ts);
    iVar2 = -0x6e;
    if (iVar1 != 0x6e) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int nn_condvar_wait (nn_condvar_t *cond, nn_mutex_t *lock, int timeout)
{
    int rc;
    struct timeval tv;
    struct timespec ts;

    if (timeout < 0) {
        /*  This is an infinite sleep.  We don't care about return values,
            as any error we can treat as just a premature wakeup. */
        (void) pthread_cond_wait (&cond->cv, &lock->mutex);
        return (0);
    }

    rc = gettimeofday(&tv, NULL);
    errnum_assert (rc == 0, rc);

    /* There are extra operations performed here, but they are done to avoid
       wrap of the tv_usec and ts_nsec members on 32-bit systems. */
    tv.tv_sec += timeout / 1000;
    tv.tv_usec += (timeout % 1000) * 1000;

    ts.tv_sec = tv.tv_sec + (tv.tv_usec / 1000000);
    ts.tv_nsec = (tv.tv_usec % 1000000) * 1000;

    rc = pthread_cond_timedwait (&cond->cv, &lock->mutex, &ts);
    if (rc == ETIMEDOUT)
        return (-ETIMEDOUT);
    /* Treat all other cases (including errors) as normal wakeup. */
    return (0);
}